

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

void __thiscall testing::internal::CapturedStream::CapturedStream(CapturedStream *this,int fd)

{
  int iVar1;
  ostream *poVar2;
  size_type *local_48;
  string name_template;
  
  this->fd_ = fd;
  iVar1 = dup(fd);
  this->uncaptured_fd_ = iVar1;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  (this->filename_)._M_string_length = 0;
  (this->filename_).field_2._M_local_buf[0] = '\0';
  local_48 = &name_template._M_string_length;
  name_template._M_dataplus._M_p = (pointer)0x0;
  name_template._M_string_length._0_1_ = 0;
  std::__cxx11::string::assign((char *)&local_48);
  std::__cxx11::string::append((char *)&local_48);
  iVar1 = mkstemp((char *)local_48);
  if (iVar1 == -1) {
    GTestLog::GTestLog((GTestLog *)((long)&name_template.field_2 + 0xc),GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/build_O2/tests/googletest-prefix/src/googletest/googletest/src/gtest-port.cc"
                       ,0x47c);
    poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to create tmp file ");
    poVar2 = std::operator<<(poVar2,(string *)&local_48);
    std::operator<<(poVar2," for test; does the test have access to the /tmp directory?");
    GTestLog::~GTestLog((GTestLog *)((long)&name_template.field_2 + 0xc));
  }
  std::__cxx11::string::operator=((string *)&this->filename_,(string *)&local_48);
  fflush((FILE *)0x0);
  dup2(iVar1,this->fd_);
  close(iVar1);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

explicit CapturedStream(int fd) : fd_(fd), uncaptured_fd_(dup(fd)) {
# if GTEST_OS_WINDOWS
    char temp_dir_path[MAX_PATH + 1] = { '\0' };  // NOLINT
    char temp_file_path[MAX_PATH + 1] = { '\0' };  // NOLINT

    ::GetTempPathA(sizeof(temp_dir_path), temp_dir_path);
    const UINT success = ::GetTempFileNameA(temp_dir_path,
                                            "gtest_redir",
                                            0,  // Generate unique file name.
                                            temp_file_path);
    GTEST_CHECK_(success != 0)
        << "Unable to create a temporary file in " << temp_dir_path;
    const int captured_fd = creat(temp_file_path, _S_IREAD | _S_IWRITE);
    GTEST_CHECK_(captured_fd != -1) << "Unable to open temporary file "
                                    << temp_file_path;
    filename_ = temp_file_path;
# else
    // There's no guarantee that a test has write access to the current
    // directory, so we create the temporary file in a temporary directory.
    std::string name_template;

#  if GTEST_OS_LINUX_ANDROID
    // Note: Android applications are expected to call the framework's
    // Context.getExternalStorageDirectory() method through JNI to get
    // the location of the world-writable SD Card directory. However,
    // this requires a Context handle, which cannot be retrieved
    // globally from native code. Doing so also precludes running the
    // code as part of a regular standalone executable, which doesn't
    // run in a Dalvik process (e.g. when running it through 'adb shell').
    //
    // The location /data/local/tmp is directly accessible from native code.
    // '/sdcard' and other variants cannot be relied on, as they are not
    // guaranteed to be mounted, or may have a delay in mounting.
    name_template = "/data/local/tmp/";
#  elif GTEST_OS_IOS
    char user_temp_dir[PATH_MAX + 1];

    // Documented alternative to NSTemporaryDirectory() (for obtaining creating
    // a temporary directory) at
    // https://developer.apple.com/library/archive/documentation/Security/Conceptual/SecureCodingGuide/Articles/RaceConditions.html#//apple_ref/doc/uid/TP40002585-SW10
    //
    // _CS_DARWIN_USER_TEMP_DIR (as well as _CS_DARWIN_USER_CACHE_DIR) is not
    // documented in the confstr() man page at
    // https://developer.apple.com/library/archive/documentation/System/Conceptual/ManPages_iPhoneOS/man3/confstr.3.html#//apple_ref/doc/man/3/confstr
    // but are still available, according to the WebKit patches at
    // https://trac.webkit.org/changeset/262004/webkit
    // https://trac.webkit.org/changeset/263705/webkit
    //
    // The confstr() implementation falls back to getenv("TMPDIR"). See
    // https://opensource.apple.com/source/Libc/Libc-1439.100.3/gen/confstr.c.auto.html
    ::confstr(_CS_DARWIN_USER_TEMP_DIR, user_temp_dir, sizeof(user_temp_dir));

    name_template = user_temp_dir;
    if (name_template.back() != GTEST_PATH_SEP_[0])
      name_template.push_back(GTEST_PATH_SEP_[0]);
#  else
    name_template = "/tmp/";
#  endif
    name_template.append("gtest_captured_stream.XXXXXX");

    // mkstemp() modifies the string bytes in place, and does not go beyond the
    // string's length. This results in well-defined behavior in C++17.
    //
    // The const_cast is needed below C++17. The constraints on std::string
    // implementations in C++11 and above make assumption behind the const_cast
    // fairly safe.
    const int captured_fd = ::mkstemp(const_cast<char*>(name_template.data()));
    if (captured_fd == -1) {
      GTEST_LOG_(WARNING)
          << "Failed to create tmp file " << name_template
          << " for test; does the test have access to the /tmp directory?";
    }
    filename_ = std::move(name_template);
# endif  // GTEST_OS_WINDOWS
    fflush(nullptr);
    dup2(captured_fd, fd_);
    close(captured_fd);
  }